

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_1::OptionsToInterpret::OptionsToInterpret
          (OptionsToInterpret *this,string *ns,string *el,vector<int,_std::allocator<int>_> *path,
          Message *orig_opt,Message *opt)

{
  pointer pcVar1;
  
  (this->name_scope)._M_dataplus._M_p = (pointer)&(this->name_scope).field_2;
  pcVar1 = (ns->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + ns->_M_string_length);
  (this->element_name)._M_dataplus._M_p = (pointer)&(this->element_name).field_2;
  pcVar1 = (el->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->element_name,pcVar1,pcVar1 + el->_M_string_length);
  std::vector<int,_std::allocator<int>_>::vector(&this->element_path,path);
  this->original_options = orig_opt;
  this->options = opt;
  return;
}

Assistant:

OptionsToInterpret(const std::string& ns, const std::string& el,
                     const std::vector<int>& path, const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        element_path(path),
        original_options(orig_opt),
        options(opt) {}